

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O0

void __thiscall
om::file::_file_stream::_file_stream(_file_stream *this,string *file_name_,openmode open_mode_)

{
  byte bVar1;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  openmode local_1c;
  string *psStack_18;
  openmode open_mode__local;
  string *file_name__local;
  _file_stream *this_local;
  
  this->_vptr__file_stream = (_func_int **)&PTR_close_00290818;
  local_1c = open_mode_;
  psStack_18 = file_name_;
  file_name__local = (string *)this;
  std::fstream::fstream(&this->_stream,(string *)file_name_,open_mode_);
  bVar1 = std::fstream::is_open();
  if ((bVar1 & 1) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_50,"om::file::_file_stream: could not open ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psStack_18);
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

explicit _file_stream(const std::string& file_name_, std::ios::openmode open_mode_)
				: _stream(file_name_, open_mode_)
			{
				if (!_stream.is_open())
					throw std::runtime_error("om::file::_file_stream: could not open " +file_name_);
			}